

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::DoCaptureByteCodeUpwardExposedUsed(BackwardPass *this)

{
  bool bVar1;
  JITTimeFunctionBody *this_00;
  
  if ((this->tag == DeadStorePhase) || (this->tag == CaptureByteCodeRegUsePhase)) {
    bVar1 = DoByteCodeUpwardExposedUsed(this);
    if (bVar1) {
      bVar1 = Func::IsJitInDebugMode(this->func);
      if (!bVar1) {
        this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        bVar1 = JITTimeFunctionBody::IsAsmJsMode(this_00);
        if (!bVar1) {
          bVar1 = Func::DoGlobOpt(this->func);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool BackwardPass::DoCaptureByteCodeUpwardExposedUsed() const
{
#if DBG
    return (this->tag == Js::CaptureByteCodeRegUsePhase || this->tag == Js::DeadStorePhase) &&
        this->DoByteCodeUpwardExposedUsed() &&
        !func->IsJitInDebugMode() &&
        !this->func->GetJITFunctionBody()->IsAsmJsMode() &&
        this->func->DoGlobOpt();
#else
    return false;
#endif
}